

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode Curl_smtp_escape_eob(connectdata *conn,ssize_t nread)

{
  SessionHandle *data;
  void *pvVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  size_t __n;
  char *pcVar6;
  undefined1 uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *local_50;
  
  data = conn->data;
  pvVar1 = (data->req).protop;
  local_50 = (data->state).scratch;
  if ((local_50 == (char *)0x0) || ((data->set).crlf == true)) {
    pcVar3 = (char *)(*Curl_cmalloc)(0x8000);
    pcVar6 = local_50;
    local_50 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      Curl_failf(data,"Failed to alloc scratch buffer!");
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    pcVar3 = (char *)0x0;
    pcVar6 = (char *)0x0;
  }
  if (nread < 1) {
    lVar10 = 0;
  }
  else {
    lVar8 = *(long *)((long)pvVar1 + 0x18);
    lVar9 = 0;
    lVar10 = 0;
    do {
      lVar2 = *(long *)((long)pvVar1 + 0x18);
      pcVar4 = (data->req).upload_fromhere;
      if ("\r\n.\r\n"[lVar2] == pcVar4[lVar9]) {
        uVar5 = lVar2 + 1;
        *(ulong *)((long)pvVar1 + 0x18) = uVar5;
        uVar7 = 1;
        if ((lVar2 != 1) && (lVar2 != 4)) {
          uVar7 = 0;
        }
LAB_004db35f:
        *(undefined1 *)((long)pvVar1 + 0x20) = uVar7;
        if (uVar5 == 0) goto LAB_004db3b0;
        if (uVar5 == 3) {
          memcpy(local_50 + lVar10,"\r\n.." + lVar8,4U - lVar8);
          lVar10 = lVar10 + (4U - lVar8);
          *(undefined8 *)((long)pvVar1 + 0x18) = 0;
          lVar8 = 0;
        }
      }
      else {
        if (lVar2 != 0) {
          memcpy(local_50 + lVar10,"\r\n.\r\n" + lVar8,lVar2 - lVar8);
          lVar10 = (lVar10 - lVar8) + *(long *)((long)pvVar1 + 0x18);
          pcVar4 = (data->req).upload_fromhere;
          uVar5 = (ulong)(pcVar4[lVar9] == '\r');
          *(ulong *)((long)pvVar1 + 0x18) = uVar5;
          uVar7 = 0;
          lVar8 = 0;
          goto LAB_004db35f;
        }
LAB_004db3b0:
        local_50[lVar10] = pcVar4[lVar9];
        lVar10 = lVar10 + 1;
      }
      lVar9 = lVar9 + 1;
    } while (nread != lVar9);
    __n = *(long *)((long)pvVar1 + 0x18) - lVar8;
    if (__n != 0) {
      memcpy(local_50 + lVar10,"\r\n.\r\n" + lVar8,__n);
      lVar10 = (lVar10 - lVar8) + *(long *)((long)pvVar1 + 0x18);
    }
  }
  if (lVar10 == nread) {
    (*Curl_cfree)(pcVar3);
  }
  else {
    (data->req).upload_fromhere = local_50;
    (data->state).scratch = local_50;
    (*Curl_cfree)(pcVar6);
    (data->req).upload_present = lVar10;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_smtp_escape_eob(struct connectdata *conn, const ssize_t nread)
{
  /* When sending a SMTP payload we must detect CRLF. sequences making sure
     they are sent as CRLF.. instead, as a . on the beginning of a line will
     be deleted by the server when not part of an EOB terminator and a
     genuine CRLF.CRLF which isn't escaped will wrongly be detected as end of
     data by the server
  */
  ssize_t i;
  ssize_t si;
  struct SessionHandle *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  char *scratch = data->state.scratch;
  char *newscratch = NULL;
  char *oldscratch = NULL;
  size_t eob_sent;

  /* Do we need to allocate a scratch buffer? */
  if(!scratch || data->set.crlf) {
    oldscratch = scratch;

    scratch = newscratch = malloc(2 * BUFSIZE);
    if(!newscratch) {
      failf(data, "Failed to alloc scratch buffer!");

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Have we already sent part of the EOB? */
  eob_sent = smtp->eob;

  /* This loop can be improved by some kind of Boyer-Moore style of
     approach but that is saved for later... */
  for(i = 0, si = 0; i < nread; i++) {
    if(SMTP_EOB[smtp->eob] == data->req.upload_fromhere[i]) {
      smtp->eob++;

      /* Is the EOB potentially the terminating CRLF? */
      if(2 == smtp->eob || SMTP_EOB_LEN == smtp->eob)
        smtp->trailing_crlf = TRUE;
      else
        smtp->trailing_crlf = FALSE;
    }
    else if(smtp->eob) {
      /* A previous substring matched so output that first */
      memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
      si += smtp->eob - eob_sent;

      /* Then compare the first byte */
      if(SMTP_EOB[0] == data->req.upload_fromhere[i])
        smtp->eob = 1;
      else
        smtp->eob = 0;

      eob_sent = 0;

      /* Reset the trailing CRLF flag as there was more data */
      smtp->trailing_crlf = FALSE;
    }

    /* Do we have a match for CRLF. as per RFC-5321, sect. 4.5.2 */
    if(SMTP_EOB_FIND_LEN == smtp->eob) {
      /* Copy the replacement data to the target buffer */
      memcpy(&scratch[si], &SMTP_EOB_REPL[eob_sent],
             SMTP_EOB_REPL_LEN - eob_sent);
      si += SMTP_EOB_REPL_LEN - eob_sent;
      smtp->eob = 0;
      eob_sent = 0;
    }
    else if(!smtp->eob)
      scratch[si++] = data->req.upload_fromhere[i];
  }

  if(smtp->eob - eob_sent) {
    /* A substring matched before processing ended so output that now */
    memcpy(&scratch[si], &SMTP_EOB[eob_sent], smtp->eob - eob_sent);
    si += smtp->eob - eob_sent;
  }

  /* Only use the new buffer if we replaced something */
  if(si != nread) {
    /* Upload from the new (replaced) buffer instead */
    data->req.upload_fromhere = scratch;

    /* Save the buffer so it can be freed later */
    data->state.scratch = scratch;

    /* Free the old scratch buffer */
    free(oldscratch);

    /* Set the new amount too */
    data->req.upload_present = si;
  }
  else
    free(newscratch);

  return CURLE_OK;
}